

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::dispatch::Attribute_Access<std::function<int_(int)>,_TestBaseType>::do_call
          (Attribute_Access<std::function<int_(int)>,_TestBaseType> *this,Function_Params *params,
          Type_Conversions_State *t_conversions)

{
  Type_Conversions *this_00;
  TestBaseType *pTVar1;
  Type_Conversions_State *in_RCX;
  Boxed_Value BVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  this_00 = (t_conversions->m_conversions)._M_data;
  if ((*(byte *)((this_00->m_mutex)._M_impl._M_rwlock.__align + 0x10) & 1) == 0) {
    pTVar1 = boxed_cast<TestBaseType*>((Boxed_Value *)this_00,in_RCX);
    BVar3 = detail::Handle_Return<std::function<int_(int)>_&>::handle
                      ((Handle_Return<std::function<int_(int)>_&> *)this,
                       (function<int_(int)> *)
                       ((long)&params[4].m_begin[-2].m_data.
                               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + (long)pTVar1->mdarray[0]));
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    pTVar1 = boxed_cast<TestBaseType_const*>
                       ((chaiscript *)this_00,(Boxed_Value *)in_RCX,t_conversions);
    BVar3 = detail::Handle_Return<const_std::function<int_(int)>_&>::handle
                      ((Handle_Return<const_std::function<int_(int)>_&> *)this,
                       (function<int_(int)> *)
                       ((long)&params[4].m_begin[-2].m_data.
                               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + (long)pTVar1->mdarray[0]));
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_call(const Function_Params &params, const Type_Conversions_State &t_conversions) const override {
        const Boxed_Value &bv = params[0];
        if (bv.is_const()) {
          const Class *o = boxed_cast<const Class *>(bv, &t_conversions);
          return do_call_impl<T>(o);
        } else {
          Class *o = boxed_cast<Class *>(bv, &t_conversions);
          return do_call_impl<T>(o);
        }
      }